

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O3

event_process_result
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::inner_state_machine<afsm::test::human_def::awake,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::human_def::sleeping,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
::process_event<afsm::test::alarm>(states_tuple *states,size_t current_state,alarm *event)

{
  event_process_result eVar1;
  function<afsm::actions::event_process_result_(std::tuple<afsm::inner_state_machine<afsm::test::human_def::awake,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::human_def::sleeping,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::alarm_&&)>
  *__x;
  logic_error *this;
  _Any_data *this_00;
  long lVar2;
  invocation_table<afsm::test::alarm> inv_table;
  indexes_tuple<0UL,_1UL> local_71;
  _Any_data local_70;
  long alStack_60 [2];
  undefined1 local_50 [16];
  undefined8 local_40 [2];
  
  if (1 < current_state) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid current state index");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  __x = inner_dispatch_table<std::tuple<afsm::inner_state_machine<afsm::test::human_def::awake,afsm::state_machine<afsm::test::human_def,afsm::none,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::human_def::sleeping,afsm::state_machine<afsm::test::human_def,afsm::none,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>
        ::state_table<afsm::test::alarm,0ul,1ul>(&local_71)->_M_elems;
  std::
  function<afsm::actions::event_process_result_(std::tuple<afsm::inner_state_machine<afsm::test::human_def::awake,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::human_def::sleeping,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::alarm_&&)>
  ::function((function<afsm::actions::event_process_result_(std::tuple<afsm::inner_state_machine<afsm::test::human_def::awake,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::human_def::sleeping,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::alarm_&&)>
              *)&local_70,__x);
  this_00 = (_Any_data *)local_50;
  std::
  function<afsm::actions::event_process_result_(std::tuple<afsm::inner_state_machine<afsm::test::human_def::awake,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::human_def::sleeping,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::alarm_&&)>
  ::function((function<afsm::actions::event_process_result_(std::tuple<afsm::inner_state_machine<afsm::test::human_def::awake,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::human_def::sleeping,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::alarm_&&)>
              *)this_00,__x + 1);
  if (*(long *)((long)alStack_60 + current_state * 0x20) != 0) {
    eVar1 = (*(code *)alStack_60[current_state * 4 + 1])(&local_70 + current_state * 2,states,event)
    ;
    lVar2 = -0x40;
    do {
      if (*(code **)(this_00 + 1) != (code *)0x0) {
        (**(code **)(this_00 + 1))(this_00,this_00,__destroy_functor);
      }
      this_00 = this_00 + -2;
      lVar2 = lVar2 + 0x20;
    } while (lVar2 != 0);
    return eVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

static event_process_result
    process_event(states_tuple& states, ::std::size_t current_state, Event&& event)
    {
        //using event_type = typename ::std::decay<Event>::type;
        if (current_state >= size)
            throw ::std::logic_error{ "Invalid current state index" };
        auto inv_table = state_table< Event >(indexes_tuple{});
        return inv_table[current_state](states, ::std::forward<Event>(event));
    }